

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_Type.cxx
# Opt level: O2

Fl_Type * __thiscall Fl_Menu_Item_Type::make(Fl_Menu_Item_Type *this)

{
  char cVar1;
  int iVar2;
  Fl_Button *pFVar3;
  Fl_Type *this_00;
  Fl_Type *p;
  char *n;
  
  p = Fl_Type::current;
  if (Fl_Type::current == (Fl_Type *)0x0) {
    force_parent = 0;
  }
  else {
    if (((force_parent != 0) &&
        (iVar2 = (*Fl_Type::current->_vptr_Fl_Type[0x1e])(Fl_Type::current), iVar2 != 0)) ||
       (iVar2 = (*p->_vptr_Fl_Type[0x16])(p), iVar2 == 0)) {
      p = p->parent;
      force_parent = 0;
      if (p == (Fl_Type *)0x0) goto LAB_0017f5c4;
    }
    force_parent = 0;
    iVar2 = (*p->_vptr_Fl_Type[0x1f])(p);
    if ((iVar2 != 0) ||
       ((iVar2 = (*p->_vptr_Fl_Type[0x1e])(p), iVar2 != 0 &&
        (iVar2 = (*p->_vptr_Fl_Type[0x16])(p), iVar2 != 0)))) {
      if ((this->super_Fl_Widget_Type).o == (Fl_Widget *)0x0) {
        pFVar3 = (Fl_Button *)operator_new(0x80);
        Fl_Button::Fl_Button(pFVar3,0,0,100,0x14,(char *)0x0);
        (this->super_Fl_Widget_Type).o = (Fl_Widget *)pFVar3;
        (pFVar3->super_Fl_Widget).label_.size = Fl_Widget_Type::default_size;
      }
      cVar1 = submenuflag;
      this_00 = (Fl_Type *)operator_new(0xf0);
      memset(this_00,0,0xf0);
      if (cVar1 == '\x01') {
        Fl_Submenu_Type::Fl_Submenu_Type((Fl_Submenu_Type *)this_00);
      }
      else {
        Fl_Menu_Item_Type((Fl_Menu_Item_Type *)this_00);
      }
      pFVar3 = (Fl_Button *)operator_new(0x80);
      Fl_Button::Fl_Button(pFVar3,0,0,100,0x14,(char *)0x0);
      this_00[1].prev = (Fl_Type *)pFVar3;
      this_00->factory = (Fl_Type *)this;
      Fl_Type::add(this_00,p);
      if (reading_file != 0) {
        return this_00;
      }
      n = "item";
      if (submenuflag != '\0') {
        n = "submenu";
      }
      Fl_Type::label(this_00,n);
      return this_00;
    }
  }
LAB_0017f5c4:
  fl_message("Please select a menu to add to");
  return (Fl_Type *)0x0;
}

Assistant:

Fl_Type *Fl_Menu_Item_Type::make() {
  // Find the current menu item:
  Fl_Type* q = Fl_Type::current;
  Fl_Type* p = q;
  if (p) {
    if ( (force_parent && q->is_menu_item()) || !q->is_parent()) p = p->parent;
  }
  force_parent = 0;
  if (!p || !(p->is_menu_button() || (p->is_menu_item() && p->is_parent()))) {
    fl_message("Please select a menu to add to");
    return 0;
  }
  if (!o) {
    o = new Fl_Button(0,0,100,20); // create template widget
    o->labelsize(Fl_Widget_Type::default_size);
  }

  Fl_Menu_Item_Type* t = submenuflag ? new Fl_Submenu_Type() : new Fl_Menu_Item_Type();
  t->o = new Fl_Button(0,0,100,20);
  t->factory = this;
  t->add(p);
  if (!reading_file) t->label(submenuflag ? "submenu" : "item");
  return t;
}